

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_smin_i64_arm(TCGContext_conflict *tcg_ctx,TCGv_i64 ret,TCGv_i64 a,TCGv_i64 b)

{
  tcg_gen_movcond_i64_arm(tcg_ctx,TCG_COND_LT,ret,a,b,a,b);
  return;
}

Assistant:

void tcg_gen_smin_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 a, TCGv_i64 b)
{
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, ret, a, b, a, b);
}